

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PassthroughTestInstance *this)

{
  undefined8 *puVar1;
  int aiVar2 [2];
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  Buffer *pBVar4;
  undefined8 uVar5;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  TestStatus *__return_storage_ptr___00;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice pVVar9;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  TextureFormat TVar10;
  ulong uVar11;
  GraphicsPipelineBuilder *pGVar12;
  ProgramBinary *pPVar13;
  TessPrimitiveType primitiveType;
  VkImageLayout oldLayout;
  Handle<(vk::HandleType)24> HVar14;
  int iVar15;
  VkFormat colorFormat;
  long lVar16;
  VkDeviceSize bufferSize;
  VkExtent3D extent;
  VkImageSubresourceLayers subresourceLayers;
  undefined4 uVar17;
  VkDevice pVVar18;
  allocator<char> local_529;
  IVec2 renderSize;
  Buffer **local_520;
  RefBase<vk::VkCommandBuffer_s_*> local_518;
  VkDeviceSize local_4f0;
  ConstPixelBufferAccess image0;
  IVec3 positionDeviation;
  Vec4 local_488;
  TestStatus *local_478;
  VkQueue local_470;
  ConstPixelBufferAccess image1;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_438;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_408;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3c8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_3b8;
  Buffer *colorBuffer [2];
  RefBase<vk::Handle<(vk::HandleType)22>_> local_388;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_368;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_2e8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_2c8;
  undefined1 local_2a8 [8];
  Handle<(vk::HandleType)14> HStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [14];
  deUint32 local_1ac;
  bool local_1a8;
  VkPrimitiveTopology local_1a4;
  Image colorAttachmentImage;
  Buffer vertexBuffer;
  Buffer tessLevelsBuffer;
  Buffer colorBuffer2;
  Buffer colorBuffer1;
  
  local_478 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar9 = Context::getDevice((this->super_TestInstance).m_context);
  local_470 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar7 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2a8,0x18,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,vk,pVVar9,allocator,(VkBufferCreateInfo *)local_2a8,
             (MemoryRequirement)0x1);
  if ((this->m_params).useTessLevels == true) {
    puVar1 = (undefined8 *)
             (tessLevelsBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar1[2] = *(undefined8 *)((this->m_params).tessLevels.outer + 2);
    uVar5 = *(undefined8 *)(this->m_params).tessLevels.outer;
    *puVar1 = *(undefined8 *)(this->m_params).tessLevels.inner;
    puVar1[1] = uVar5;
    ::vk::flushMappedMemoryRange
              (vk,pVVar9,
               (VkDeviceMemory)
               ((tessLevelsBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (tessLevelsBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
  }
  bufferSize = (long)(this->m_params).vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_params).vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2a8,bufferSize,0x80);
  pVVar18 = pVVar9;
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,pVVar9,allocator,(VkBufferCreateInfo *)local_2a8,
             (MemoryRequirement)0x1);
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         (this->m_params).vertices.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,pVVar9,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_2a8);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)local_2a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&image0,this_00,vk,pVVar18,0);
  local_368.m_data.deleter.m_device = (VkDevice)image0._16_8_;
  local_368.m_data.deleter.m_allocator = (VkAllocationCallbacks *)image0.m_pitch.m_data._4_8_;
  local_368.m_data.object.m_internal._0_4_ = image0.m_format.order;
  local_368.m_data.object.m_internal._4_4_ = image0.m_format.type;
  local_368.m_data.deleter.m_deviceIface = (DeviceInterface *)image0.m_size.m_data._0_8_;
  image0.m_format.order = R;
  image0.m_format.type = SNORM_INT8;
  image0.m_size.m_data[0] = 0;
  image0.m_size.m_data[1] = 0;
  image0.m_size.m_data[2] = 0;
  image0.m_pitch.m_data[0] = 0;
  image0.m_pitch.m_data[1] = 0;
  image0.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&image0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_2a8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&image0);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&image0,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pVVar9 = pVVar18;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_2a8,this_01,vk,pVVar18,1,1);
  local_2c8.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_2c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_2c8.m_data.object.m_internal = (deUint64)local_2a8;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_2a8);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&image0);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)local_2a8,vk,pVVar18,
                    (VkDescriptorPool)local_2c8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_368.m_data.object.m_internal);
  local_388.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_388.m_data.deleter.m_pool.m_internal = local_298[0]._8_8_;
  local_388.m_data.object.m_internal = (deUint64)local_2a8;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2a8);
  tessLevelsBufferInfo.buffer.m_internal =
       tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  tessLevelsBufferInfo.offset = 0;
  tessLevelsBufferInfo.range = 0x18;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_2a8);
  image0.m_format.order = R;
  image0.m_format.type = SNORM_INT8;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)local_2a8,
                       (VkDescriptorSet)local_388.m_data.object.m_internal,(Location *)&image0,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&tessLevelsBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,pVVar9);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_2a8);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)local_2a8,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,pVVar9,allocator,(VkImageCreateInfo *)local_2a8,
               (MemoryRequirement)0x0);
  iVar15 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar10 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize(TVar10);
  local_4f0 = (VkDeviceSize)(iVar15 * iVar8);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2a8,local_4f0,2);
  tessellation::Buffer::Buffer
            (&colorBuffer1,vk,pVVar9,allocator,(VkBufferCreateInfo *)local_2a8,
             (MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2a8,local_4f0,2);
  pVVar18 = pVVar9;
  tessellation::Buffer::Buffer
            (&colorBuffer2,vk,pVVar9,allocator,(VkBufferCreateInfo *)local_2a8,
             (MemoryRequirement)0x1);
  local_3d8 = 1;
  uStack_3d0 = 1;
  local_3c8 = 1;
  subresourceRange.levelCount._0_1_ = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange._9_7_ = 0;
  subresourceRange.layerCount = 1;
  colorBuffer[0] = &colorBuffer1;
  colorBuffer[1] = &colorBuffer2;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_2a8,vk,pVVar9,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_2e8.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_2e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_2e8.m_data.object.m_internal = (deUint64)local_2a8;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_2a8);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)local_2a8,vk,pVVar9,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_438.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_438.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_438.m_data.object.m_internal = (deUint64)local_2a8;
  local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_2a8);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_2a8,vk,pVVar9,
                  (VkRenderPass)local_438.m_data.object.m_internal,
                  (VkImageView)local_2e8.m_data.object.m_internal,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  local_308.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_308.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_308.m_data.object.m_internal = (deUint64)local_2a8;
  local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_2a8);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_2a8,vk,pVVar9,
                     (VkDescriptorSetLayout)local_368.m_data.object.m_internal);
  local_3b8.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_3b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_3b8.m_data.object.m_internal = (deUint64)local_2a8;
  local_3b8.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_2a8);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_2a8,vk,pVVar9,dVar7);
  local_328.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_298[0]._8_8_;
  local_328.m_data.object.m_internal = (deUint64)local_2a8;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_2a8);
  HVar14.m_internal = local_328.m_data.object.m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_2a8,vk,pVVar9,
             (VkCommandPool)local_328.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  primitiveType = (TessPrimitiveType)HVar14.m_internal;
  local_518.m_data.deleter.m_device = (VkDevice)local_298[0]._0_8_;
  local_518.m_data.deleter.m_pool.m_internal = local_298[0]._8_8_;
  local_518.m_data.object = (VkCommandBuffer_s *)local_2a8;
  local_518.m_data.deleter.m_deviceIface = (DeviceInterface *)HStack_2a0.m_internal;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = 0;
  HStack_2a0.m_internal = 0;
  local_298[0]._M_allocated_capacity = (pointer)0x0;
  local_298[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  aiVar2 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2a8 = (undefined1  [8])aiVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_2a0);
  std::operator<<((ostream *)&HStack_2a0,(string *)&(this->m_params).message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_2a0);
  if ((this->m_params).useTessLevels == true) {
    local_2a8 = (undefined1  [8])aiVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_2a0);
    std::operator<<((ostream *)&HStack_2a0,"Tessellation levels: ");
    getTessellationLevelsString_abi_cxx11_
              ((string *)&image0,(tessellation *)&(this->m_params).tessLevels,
               (TessLevels *)(ulong)(this->m_params).primitiveType,primitiveType);
    std::operator<<((ostream *)&HStack_2a0,(string *)&image0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&image0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_2a0);
  }
  local_520 = colorBuffer;
  for (lVar16 = 0; lVar16 != 0xd0; lVar16 = lVar16 + 0x68) {
    memset(&HStack_2a0,0,0xf4);
    local_1ac = 1;
    uVar11 = (ulong)(this->m_params).primitiveType;
    local_1a4 = VK_PRIMITIVE_TOPOLOGY_LAST;
    if (uVar11 < 3) {
      local_1a4 = *(VkPrimitiveTopology *)(&DAT_009e6ee0 + uVar11 * 4);
    }
    local_2a8._0_4_ = renderSize.m_data[0];
    local_2a8._4_4_ = renderSize.m_data[1];
    local_1a8 = true;
    TVar10 = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_SFLOAT);
    dVar7 = tcu::getPixelSize(TVar10);
    pGVar12 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                        ((GraphicsPipelineBuilder *)local_2a8,VK_FORMAT_R32G32B32A32_SFLOAT,dVar7);
    pGVar12->m_patchControlPoints = (this->m_params).inputPatchVertices;
    pPVar3 = ((this->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image0,"vert",(allocator<char> *)&local_488);
    pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&image0);
    pGVar12 = GraphicsPipelineBuilder::setShader
                        (pGVar12,vk,pVVar18,VK_SHADER_STAGE_VERTEX_BIT,pPVar13,
                         (VkSpecializationInfo *)0x0);
    pPVar3 = ((this->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image1,"frag",(allocator<char> *)&positionDeviation);
    pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&image1);
    GraphicsPipelineBuilder::setShader
              (pGVar12,vk,pVVar18,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar13,(VkSpecializationInfo *)0x0);
    std::__cxx11::string::~string((string *)&image1);
    std::__cxx11::string::~string((string *)&image0);
    if ((&(this->m_params).pipelineCases[0].useTessellation)[lVar16] == true) {
      pPVar3 = ((this->super_TestInstance).m_context)->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&image0,"tesc",(allocator<char> *)&image1);
      pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&image0);
      pGVar12 = GraphicsPipelineBuilder::setShader
                          ((GraphicsPipelineBuilder *)local_2a8,vk,pVVar18,
                           VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar13,
                           (VkSpecializationInfo *)0x0);
      pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                          (((this->super_TestInstance).m_context)->m_progCollection,
                           (string *)
                           ((long)&(this->m_params).pipelineCases[0].tessEvalShaderName._M_dataplus.
                                   _M_p + lVar16));
      GraphicsPipelineBuilder::setShader
                (pGVar12,vk,pVVar18,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar13,
                 (VkSpecializationInfo *)0x0);
      std::__cxx11::string::~string((string *)&image0);
    }
    if ((&(this->m_params).pipelineCases[0].useGeometry)[lVar16] == true) {
      pPVar13 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                          (((this->super_TestInstance).m_context)->m_progCollection,
                           (string *)
                           ((long)&(this->m_params).pipelineCases[0].geomShaderName._M_dataplus._M_p
                           + lVar16));
      GraphicsPipelineBuilder::setShader
                ((GraphicsPipelineBuilder *)local_2a8,vk,pVVar18,VK_SHADER_STAGE_GEOMETRY_BIT,
                 pPVar13,(VkSpecializationInfo *)0x0);
    }
    GraphicsPipelineBuilder::build
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&image0,(GraphicsPipelineBuilder *)local_2a8
               ,vk,pVVar18,(VkPipelineLayout)local_3b8.m_data.object.m_internal,
               (VkRenderPass)local_438.m_data.object.m_internal);
    image1.m_size.m_data[2] = image0.m_size.m_data[2];
    image1.m_pitch.m_data[0] = image0.m_pitch.m_data[0];
    image1.m_pitch.m_data[1] = image0.m_pitch.m_data[1];
    image1.m_pitch.m_data[2] = image0.m_pitch.m_data[2];
    image1.m_format = image0.m_format;
    image1.m_size.m_data[0] = image0.m_size.m_data[0];
    image1.m_size.m_data[1] = image0.m_size.m_data[1];
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    image0.m_size.m_data[0] = 0;
    image0.m_size.m_data[1] = 0;
    image0.m_size.m_data[2] = 0;
    image0.m_pitch.m_data[0] = 0;
    image0.m_pitch.m_data[1] = 0;
    image0.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&image0);
    beginCommandBuffer(vk,local_518.m_data.object);
    oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
    if (lVar16 == 0) {
      oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    }
    local_3f8 = 1;
    uStack_3f0 = 1;
    local_3e8 = 1;
    subresourceRange_00.levelCount._0_1_ = 1;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00._9_7_ = 0;
    subresourceRange_00.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,(uint)(lVar16 != 0) << 0xb,0x100,oldLayout,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                        m_data.object.m_internal,subresourceRange_00);
    uVar17 = SUB84((VkImageMemoryBarrier *)&image0,0);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,local_518.m_data.object,0x1001,0x80,0,0,0,0,0,1,uVar17);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    image0.m_size.m_data[0] = renderSize.m_data[0];
    image0.m_size.m_data[1] = renderSize.m_data[1];
    local_488.m_data[0] = 0.0;
    local_488.m_data[1] = 0.0;
    local_488.m_data[2] = 0.0;
    local_488.m_data[3] = 1.0;
    beginRenderPass(vk,local_518.m_data.object,(VkRenderPass)local_438.m_data.object.m_internal,
                    (VkFramebuffer)local_308.m_data.object.m_internal,(VkRect2D *)&image0,&local_488
                   );
    (*vk->_vptr_DeviceInterface[0x4c])(vk,local_518.m_data.object,0,image1.m_format);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,local_518.m_data.object,0,1,&vertexBuffer,(VkImageMemoryBarrier *)&image0);
    if ((this->m_params).useTessLevels == true) {
      (*vk->_vptr_DeviceInterface[0x56])
                (vk,local_518.m_data.object,0,local_3b8.m_data.object.m_internal,0,1,&local_388,0,0)
      ;
    }
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,local_518.m_data.object,
               (ulong)((long)(this->m_params).vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_params).vertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
    endRenderPass(vk,local_518.m_data.object);
    local_418 = 1;
    uStack_410 = 1;
    local_408 = 1;
    subresourceRange_01.levelCount._0_1_ = 1;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01._9_7_ = 0;
    subresourceRange_01.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                        m_data.object.m_internal,subresourceRange_01);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,local_518.m_data.object,0x400,0x1000,0,0,0,0,0,1,uVar17);
    extent.depth = 1;
    extent.width = renderSize.m_data[0];
    extent.height = renderSize.m_data[1];
    subresourceLayers.baseArrayLayer = 0;
    subresourceLayers.layerCount = 1;
    subresourceLayers.aspectMask = 1;
    subresourceLayers.mipLevel = 0;
    makeBufferImageCopy((VkBufferImageCopy *)&image0,extent,subresourceLayers);
    pBVar4 = *local_520;
    (*vk->_vptr_DeviceInterface[99])
              (vk,local_518.m_data.object,
               colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
               object.m_internal,6,
               (pBVar4->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,1,uVar17);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&image0,0x1000,0x2000,
               (VkBuffer)
               (pBVar4->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,local_4f0);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,local_518.m_data.object,0x1000,0x4000,0,0,0,1,(VkImageMemoryBarrier *)&image0,0,0)
    ;
    endCommandBuffer(vk,local_518.m_data.object);
    submitCommandsAndWait(vk,pVVar18,local_470,local_518.m_data.object);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&image1);
    GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_2a8);
    local_520 = local_520 + 1;
  }
  colorFormat = (VkFormat)local_4f0;
  pVVar9 = pVVar18;
  getPixelBufferAccess
            (&image0,vk,pVVar18,&colorBuffer1,colorFormat,(VkDeviceSize)&renderSize,(IVec2 *)pVVar18
            );
  getPixelBufferAccess
            (&image1,vk,pVVar18,&colorBuffer2,colorFormat,(VkDeviceSize)&renderSize,(IVec2 *)pVVar9)
  ;
  local_488.m_data[0] = 1.12104e-44;
  local_488.m_data[1] = 1.12104e-44;
  local_488.m_data[2] = 1.12104e-44;
  local_488.m_data[3] = 3.57331e-43;
  positionDeviation.m_data[0] = 1;
  positionDeviation.m_data[1] = 1;
  positionDeviation.m_data[2] = 0;
  aiVar2 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2a8 = (undefined1  [8])aiVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_2a0);
  std::operator<<((ostream *)&HStack_2a0,"In image comparison:\n");
  std::operator<<((ostream *)&HStack_2a0,"  Reference - ");
  std::operator<<((ostream *)&HStack_2a0,(string *)&(this->m_params).pipelineCases[0].description);
  std::operator<<((ostream *)&HStack_2a0,"\n");
  std::operator<<((ostream *)&HStack_2a0,"  Result    - ");
  std::operator<<((ostream *)&HStack_2a0,(string *)&(this->m_params).pipelineCases[1].description);
  std::operator<<((ostream *)&HStack_2a0,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_2a0);
  bVar6 = tcu::intThresholdPositionDeviationCompare
                    ((TestLog *)aiVar2,"ImageCompare","Image comparison",&image0,&image1,
                     (UVec4 *)&local_488,&positionDeviation,true,COMPARE_LOG_RESULT);
  __return_storage_ptr___00 = local_478;
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a8,"OK",&local_529);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)local_2a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a8,"Image comparison failed",&local_529);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_2a8);
  }
  std::__cxx11::string::~string((string *)local_2a8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_518);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_328);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_3b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_308);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_438);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_2e8);
  tessellation::Buffer::~Buffer(&colorBuffer2);
  tessellation::Buffer::~Buffer(&colorBuffer1);
  Image::~Image(&colorAttachmentImage);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_388);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_2c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_368);
  tessellation::Buffer::~Buffer(&vertexBuffer);
  tessellation::Buffer::~Buffer(&tessLevelsBuffer);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus PassthroughTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);
	DE_STATIC_ASSERT(PIPELINE_CASES == 2);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Tessellation levels
	const Buffer tessLevelsBuffer (vk, device, allocator, makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	if (m_params.useTessLevels)
	{
		const Allocation& alloc = tessLevelsBuffer.getAllocation();
		TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
		*bufferTessLevels = m_params.tessLevels;
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
	}

	// Vertex attributes

	const VkDeviceSize	vertexDataSizeBytes = sizeInBytes(m_params.vertices);
	const VkFormat		vertexFormat		= VK_FORMAT_R32G32B32A32_SFLOAT;
	const Buffer		vertexBuffer		(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_params.vertices[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Descriptors - make descriptor for tessellation levels, even if we don't use them, to simplify code

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet		   (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo = makeDescriptorBufferInfo(*tessLevelsBuffer, 0ull, sizeof(TessLevels));

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.update(vk, device);

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification.
	//                      We use two buffers, one for each case.

	const VkDeviceSize	colorBufferSizeBytes		= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer1				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer		colorBuffer2				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer* const colorBuffer[PIPELINE_CASES] = { &colorBuffer1, &colorBuffer2 };

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Message explaining the test
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Message << m_params.message << tcu::TestLog::EndMessage;

		if (m_params.useTessLevels)
			log << tcu::TestLog::Message << "Tessellation levels: " << getTessellationLevelsString(m_params.tessLevels, m_params.primitiveType) << tcu::TestLog::EndMessage;
	}

	for (int pipelineNdx = 0; pipelineNdx < PIPELINE_CASES; ++pipelineNdx)
	{
		const PipelineDescription& pipelineDescription = m_params.pipelineCases[pipelineNdx];
		GraphicsPipelineBuilder	   pipelineBuilder;

		pipelineBuilder
			.setPrimitiveTopology		  (getPrimitiveTopology(m_params.primitiveType))
			.setRenderSize				  (renderSize)
			.setBlend					  (true)
			.setVertexInputSingleAttribute(vertexFormat, tcu::getPixelSize(mapVkFormat(vertexFormat)))
			.setPatchControlPoints		  (m_params.inputPatchVertices)
			.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
			.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL);

		if (pipelineDescription.useTessellation)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(pipelineDescription.tessEvalShaderName), DE_NULL);

		if (pipelineDescription.useGeometry)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				m_context.getBinaryCollection().get(pipelineDescription.geomShaderName), DE_NULL);

		const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

		// Draw commands

		beginCommandBuffer(vk, *cmdBuffer);

		// Change color attachment image layout
		{
			// State is slightly different on the first iteration.
			const VkImageLayout currentLayout = (pipelineNdx == 0 ? VK_IMAGE_LAYOUT_UNDEFINED : VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
			const VkAccessFlags srcFlags	  = (pipelineNdx == 0 ? (VkAccessFlags)0          : (VkAccessFlags)VK_ACCESS_TRANSFER_READ_BIT);

			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				srcFlags, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				currentLayout, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT | VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		// Begin render pass
		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		if (m_params.useTessLevels)
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(m_params.vertices.size()), 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		// Copy render result to a host-visible buffer
		{
			const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer[pipelineNdx]->get(), 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, colorBuffer[pipelineNdx]->get(), 0ull, colorBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results

	tcu::ConstPixelBufferAccess image0 = getPixelBufferAccess(vk, device, *colorBuffer[0], colorFormat, colorBufferSizeBytes, renderSize);
	tcu::ConstPixelBufferAccess image1 = getPixelBufferAccess(vk, device, *colorBuffer[1], colorFormat, colorBufferSizeBytes, renderSize);

	const tcu::UVec4 colorThreshold    (8, 8, 8, 255);
	const tcu::IVec3 positionDeviation (1, 1, 0);		// 3x3 search kernel
	const bool		 ignoreOutOfBounds = true;

	tcu::TestLog& log = m_context.getTestContext().getLog();
	log << tcu::TestLog::Message
		<< "In image comparison:\n"
		<< "  Reference - " << m_params.pipelineCases[0].description << "\n"
		<< "  Result    - " << m_params.pipelineCases[1].description << "\n"
		<< tcu::TestLog::EndMessage;

	const bool ok = tcu::intThresholdPositionDeviationCompare(
		log, "ImageCompare", "Image comparison", image0, image1, colorThreshold, positionDeviation, ignoreOutOfBounds, tcu::COMPARE_LOG_RESULT);

	return (ok ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}